

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gates.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::find_if_then_else(Internal *this,Eliminator *eliminator,int pivot)

{
  int64_t *piVar1;
  pointer pvVar2;
  Clause *d;
  int iVar3;
  int iVar4;
  int iVar5;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *this_00;
  bool bVar6;
  uint uVar7;
  int b;
  pointer ppCVar9;
  int iVar10;
  Clause *d2;
  Clause *d1;
  Clause *dj;
  Clause *di;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  pointer local_88;
  Internal *local_80;
  pointer local_78;
  vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *local_70;
  Clause *local_68;
  pointer local_60;
  Clause *local_58;
  value_type local_50;
  Clause *local_48;
  Clause *local_40;
  Clause *local_38;
  int iVar8;
  
  if (((((this->opts).elimites != 0) && (this->unsat == false)) && (this->vals[pivot] == '\0')) &&
     ((eliminator->gates).super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (eliminator->gates).super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_70 = &eliminator->gates;
    local_a8 = -pivot;
    iVar8 = pivot;
    if (pivot < 1) {
      iVar8 = local_a8;
    }
    uVar7 = iVar8 << 1 | (uint)pivot >> 0x1f;
    pvVar2 = (this->otab).
             super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_78 = *(pointer *)
                ((long)&pvVar2[uVar7].
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data + 8);
    local_60 = pvVar2[uVar7].
               super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_ac = pivot;
    local_80 = this;
    local_88 = local_60;
    for (; local_88 = local_88 + 1, local_60 != local_78; local_60 = local_60 + 1) {
      local_68 = *local_60;
      local_38 = local_68;
      bVar6 = get_ternary_clause(this,local_68,&local_b0,&local_8c,&local_90);
      if (bVar6) {
        local_b8 = local_8c;
        if (local_8c == pivot) {
          local_b8 = local_b0;
          local_b0 = pivot;
        }
        local_9c = local_90;
        if (local_90 == pivot) {
          local_9c = local_b0;
        }
        local_a0 = -local_b8;
        if (0 < local_b8) {
          local_a0 = local_b8;
        }
        local_a4 = -local_9c;
        ppCVar9 = local_88;
        if (local_9c < 1) {
          local_9c = local_a4;
        }
        for (; ppCVar9 != local_78; ppCVar9 = ppCVar9 + 1) {
          d = *ppCVar9;
          local_40 = d;
          bVar6 = get_ternary_clause(this,d,&local_b4,&local_94,&local_98);
          iVar8 = local_a8;
          if (bVar6) {
            b = local_94;
            if (local_94 == pivot) {
              b = local_b4;
              local_b4 = pivot;
            }
            iVar10 = local_98;
            if (local_98 == pivot) {
              iVar10 = local_b4;
            }
            iVar3 = -iVar10;
            if (0 < iVar10) {
              iVar3 = iVar10;
            }
            iVar4 = -b;
            if (0 < b) {
              iVar4 = b;
            }
            iVar5 = iVar10;
            if (local_a0 == iVar3) {
              iVar5 = b;
              iVar3 = iVar4;
              b = iVar10;
            }
            if (((local_9c != iVar3) && (local_b8 == -b)) &&
               (local_48 = find_ternary_clause(this,local_a8,local_b8,local_a4), pivot = local_ac,
               local_48 != (Clause *)0x0)) {
              local_58 = local_48;
              local_50 = find_ternary_clause(this,iVar8,b,-iVar5);
              this_00 = local_70;
              if (local_50 != (Clause *)0x0) {
                local_68->field_0x8 = local_68->field_0x8 | 0x20;
                d->field_0x8 = d->field_0x8 | 0x20;
                local_58->field_0x8 = local_58->field_0x8 | 0x20;
                local_50->field_0x8 = local_50->field_0x8 | 0x20;
                std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                          (local_70,&local_38);
                std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                          (this_00,&local_40);
                std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                          (this_00,&local_48);
                std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::push_back
                          (this_00,&local_50);
                piVar1 = &(local_80->stats).elimgates;
                *piVar1 = *piVar1 + 1;
                piVar1 = &(local_80->stats).elimites;
                *piVar1 = *piVar1 + 1;
                return;
              }
              local_50 = (value_type)0x0;
              this = local_80;
              pivot = local_ac;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Internal::find_if_then_else (Eliminator &eliminator, int pivot) {

  if (!opts.elimites)
    return;

  assert (opts.elimsubst);

  if (unsat)
    return;
  if (val (pivot))
    return;
  if (!eliminator.gates.empty ())
    return;

  const Occs &os = occs (pivot);
  const auto end = os.end ();
  for (auto i = os.begin (); i != end; i++) {
    Clause *di = *i;
    int ai, bi, ci;
    if (!get_ternary_clause (di, ai, bi, ci))
      continue;
    if (bi == pivot)
      swap (ai, bi);
    if (ci == pivot)
      swap (ai, ci);
    assert (ai == pivot);
    for (auto j = i + 1; j != end; j++) {
      Clause *dj = *j;
      int aj, bj, cj;
      if (!get_ternary_clause (dj, aj, bj, cj))
        continue;
      if (bj == pivot)
        swap (aj, bj);
      if (cj == pivot)
        swap (aj, cj);
      assert (aj == pivot);
      if (abs (bi) == abs (cj))
        swap (bj, cj);
      if (abs (ci) == abs (cj))
        continue;
      if (bi != -bj)
        continue;
      Clause *d1 = find_ternary_clause (-pivot, bi, -ci);
      if (!d1)
        continue;
      Clause *d2 = find_ternary_clause (-pivot, bj, -cj);
      if (!d2)
        continue;
      LOG (di, "1st if-then-else");
      LOG (dj, "2nd if-then-else");
      LOG (d1, "3rd if-then-else");
      LOG (d2, "4th if-then-else");
      LOG ("found ITE gate %d == (%d ? %d : %d)", pivot, -bi, -ci, -cj);
      assert (!di->gate);
      assert (!dj->gate);
      assert (!d1->gate);
      assert (!d2->gate);
      di->gate = true;
      dj->gate = true;
      d1->gate = true;
      d2->gate = true;
      eliminator.gates.push_back (di);
      eliminator.gates.push_back (dj);
      eliminator.gates.push_back (d1);
      eliminator.gates.push_back (d2);
      stats.elimgates++;
      stats.elimites++;
      return;
    }
  }
}